

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_sid.cpp
# Opt level: O3

bool __thiscall
cppcms::sessions::session_sid::load
          (session_sid *this,session_interface *session,string *data,time_t *timeout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  time_t tVar5;
  string *__return_storage_ptr__;
  string tmp_data;
  string id;
  string local_70;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__ = &local_70;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  session_interface::get_session_cookie_abi_cxx11_(__return_storage_ptr__,session);
  bVar3 = valid_sid((session_sid *)__return_storage_ptr__,&local_70,&local_50);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (!bVar3) {
    bVar3 = false;
    goto LAB_0020f3e9;
  }
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  peVar2 = (this->storage_).
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  iVar4 = (*peVar2->_vptr_session_storage[1])(peVar2,&local_50,timeout,data);
  if ((char)iVar4 == '\0') {
LAB_0020f3d4:
    bVar3 = false;
  }
  else {
    tVar5 = time((time_t *)0x0);
    bVar3 = true;
    if (*timeout < tVar5) {
      peVar2 = (this->storage_).
               super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar2->_vptr_session_storage[2])(peVar2,&local_50);
      goto LAB_0020f3d4;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
LAB_0020f3e9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool session_sid::load(session_interface &session,std::string &data,time_t &timeout)
{
	std::string id;
	if(!valid_sid(session.get_session_cookie(),id))
		return false;
	std::string tmp_data;
	if(!storage_->load(id,timeout,data))
		return false;
	if(time(0) > timeout) {
		storage_->remove(id);
		return false;
	}
	return true;
}